

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O0

void verbose_help(void)

{
  char **local_10;
  char **str;
  
  for (local_10 = verbose_help::long_help; *local_10 != (char *)0x0; local_10 = local_10 + 1) {
    printf("%s\n",*local_10);
  }
  usage();
  return;
}

Assistant:

static void verbose_help(void)
{
    static const char *long_help[] = {
	"",
	"dlb COMMANDoptions args... files...",
	"  commands:",
	"    dlb ?   print this text",
	"    dlb h   ditto",
	"    dlb x   extract all files",
	"    dlb c   create the archive",
	"    dlb t   list table of contents",
	"  options:",
	"    v       verbose operation",
	"    f file  specify archive file name",
	"    I file  specify file for list of file names",
	"    C dir   change directory before processing any files",
	"",
	NULL
    };
    const char **str;

    for (str = long_help; *str; str++)
	printf("%s\n", *str);
    usage();
}